

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::membrane
          (anon_unknown_0 *this,Own<capnp::ClientHook> *inner,MembranePolicy *policy,bool reverse)

{
  Own<capnp::ClientHook> *other;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> OVar1;
  Own<capnp::ClientHook> local_38;
  byte local_21;
  MembranePolicy *pMStack_20;
  bool reverse_local;
  MembranePolicy *policy_local;
  Own<capnp::ClientHook> *inner_local;
  
  local_21 = reverse;
  pMStack_20 = policy;
  policy_local = (MembranePolicy *)inner;
  inner_local = (Own<capnp::ClientHook> *)this;
  other = kj::mv<kj::Own<capnp::ClientHook>>(inner);
  kj::Own<capnp::ClientHook>::Own(&local_38,other);
  MembraneHook::wrap((MembraneHook *)this,&local_38,pMStack_20,(bool)(local_21 & 1));
  kj::Own<capnp::ClientHook>::~Own(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> membrane(kj::Own<ClientHook> inner, MembranePolicy& policy, bool reverse) {
  return MembraneHook::wrap(kj::mv(inner), policy, reverse);
}